

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_> *
__thiscall
wallet::LegacyDataSPKM::GetScriptPubKeys
          (unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
           *__return_storage_ptr__,LegacyDataSPKM *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *scriptPubKey;
  bool bVar2;
  int iVar3;
  TxoutType TVar4;
  _Base_ptr p_Var5;
  __hashtable *__h;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witprog;
  int wit_ver;
  unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
  *local_128;
  unique_lock<std::recursive_mutex> local_120;
  unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
  *local_110;
  uchar auStack_108 [8];
  uchar local_100 [8];
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_f8;
  undefined1 local_b0;
  direct_or_indirect local_a8;
  uint local_8c;
  direct_or_indirect local_80;
  uint local_64;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_120._M_device = &(this->super_FillableSigningProvider).cs_KeyStore.super_recursive_mutex;
  local_120._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_120);
  SaltedSipHasher::SaltedSipHasher((SaltedSipHasher *)__return_storage_ptr__);
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  p_Var5 = (this->super_FillableSigningProvider).mapKeys._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_left;
  p_Var1 = &(this->super_FillableSigningProvider).mapKeys._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      CKey::GetPubKey((CPubKey *)&local_80.indirect_contents,(CKey *)&p_Var5[1]._M_right);
      GetScriptForRawPubKey((CScript *)&local_f8._M_first,(CPubKey *)&local_80.indirect_contents);
      local_a8.indirect_contents.indirect = (char *)__return_storage_ptr__;
      std::
      _Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<CScript,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<CScript,true>>>>
                ((_Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__,&local_f8,&local_a8);
      if (0x1c < (uint)local_f8._28_4_) {
        free((void *)local_f8._0_8_);
      }
      PKHash::PKHash((PKHash *)&local_110,(CPubKey *)&local_80.indirect_contents);
      local_f8._M_first._M_storage._M_storage[0x10] = local_100[0];
      local_f8._M_first._M_storage._M_storage[0x11] = local_100[1];
      local_f8._M_first._M_storage._M_storage[0x12] = local_100[2];
      local_f8._M_first._M_storage._M_storage[0x13] = local_100[3];
      local_f8._0_8_ = local_110;
      local_f8._M_first._M_storage._M_storage[8] = auStack_108[0];
      local_f8._M_first._M_storage._M_storage[9] = auStack_108[1];
      local_f8._M_first._M_storage._M_storage[10] = auStack_108[2];
      local_f8._M_first._M_storage._M_storage[0xb] = auStack_108[3];
      local_f8._M_first._M_storage._M_storage[0xc] = auStack_108[4];
      local_f8._M_first._M_storage._M_storage[0xd] = auStack_108[5];
      local_f8._M_first._M_storage._M_storage[0xe] = auStack_108[6];
      local_f8._M_first._M_storage._M_storage[0xf] = auStack_108[7];
      local_b0 = 2;
      GetScriptForDestination
                ((CScript *)&local_a8.indirect_contents,(CTxDestination *)&local_f8._M_first);
      local_128 = __return_storage_ptr__;
      std::
      _Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<CScript,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<CScript,true>>>>
                ((_Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__,&local_a8,&local_128);
      if (0x1c < local_8c) {
        free(local_a8.indirect_contents.indirect);
        local_a8.indirect_contents.indirect = (char *)0x0;
      }
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&local_f8._M_first);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  p_Var5 = (this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      GetScriptForRawPubKey((CScript *)&local_f8._M_first,(CPubKey *)&p_Var5[1]._M_right);
      local_80.indirect_contents.indirect = (char *)__return_storage_ptr__;
      std::
      _Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<CScript,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<CScript,true>>>>
                ((_Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__,&local_f8,&local_80);
      if (0x1c < (uint)local_f8._28_4_) {
        free((void *)local_f8._0_8_);
      }
      PKHash::PKHash((PKHash *)&local_a8.indirect_contents,(CPubKey *)&p_Var5[1]._M_right);
      local_f8._16_4_ = local_a8._16_4_;
      local_f8._0_8_ = local_a8.indirect_contents.indirect;
      local_f8._8_8_ = local_a8._8_8_;
      local_b0 = 2;
      GetScriptForDestination
                ((CScript *)&local_80.indirect_contents,(CTxDestination *)&local_f8._M_first);
      local_110 = __return_storage_ptr__;
      std::
      _Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<CScript,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<CScript,true>>>>
                ((_Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__,&local_80,&local_110);
      if (0x1c < local_64) {
        free(local_80.indirect_contents.indirect);
        local_80.indirect_contents.indirect = (char *)0x0;
      }
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&local_f8._M_first);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  for (p_Var5 = (this->super_FillableSigningProvider).mapScripts._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var5 !=
      &(this->super_FillableSigningProvider).mapScripts._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
    scriptPubKey = &p_Var5[1]._M_right;
    iVar3 = (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[3])(this,scriptPubKey);
    if (iVar3 == 2) {
      bVar2 = CScript::IsPayToScriptHash((CScript *)scriptPubKey);
      if (!bVar2) {
        ScriptHash::ScriptHash((ScriptHash *)&local_a8.indirect_contents,(CScript *)scriptPubKey);
        local_f8._16_4_ = local_a8._16_4_;
        local_f8._0_8_ = local_a8.indirect_contents.indirect;
        local_f8._8_8_ = local_a8._8_8_;
        local_b0 = 3;
        GetScriptForDestination
                  ((CScript *)&local_80.indirect_contents,(CTxDestination *)&local_f8._M_first);
        local_110 = __return_storage_ptr__;
        std::
        _Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<CScript,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<CScript,true>>>>
                  ((_Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)__return_storage_ptr__,&local_80,&local_110);
        if (0x1c < local_64) {
          free(local_80.indirect_contents.indirect);
          local_80.indirect_contents.indirect = (char *)0x0;
        }
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_f8._M_first);
      }
      local_a8._0_4_ = 0xffffffff;
      local_f8._0_8_ =
           (unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
            *)0x0;
      local_f8._8_8_ = 0;
      local_f8._16_8_ = 0;
      bVar2 = CScript::IsWitnessProgram
                        ((CScript *)scriptPubKey,(int *)local_a8.direct,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8._M_first
                        );
      if (bVar2 && local_a8._0_4_ == 0) {
        local_80.indirect_contents.indirect = (char *)__return_storage_ptr__;
        std::
        _Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<CScript_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<CScript,true>>>>
                  ((_Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)__return_storage_ptr__,scriptPubKey,&local_80);
      }
      if ((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
           *)local_f8._0_8_ !=
          (unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
           *)0x0) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
      }
    }
    else {
      local_a8.indirect_contents.indirect = (char *)0x0;
      local_a8._8_8_ = 0;
      local_a8._16_8_ = 0;
      TVar4 = Solver((CScript *)scriptPubKey,
                     (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&local_a8.indirect_contents);
      if (TVar4 == MULTISIG) {
        ScriptHash::ScriptHash((ScriptHash *)&local_110,(CScript *)scriptPubKey);
        local_f8._M_first._M_storage._M_storage[0x10] = local_100[0];
        local_f8._M_first._M_storage._M_storage[0x11] = local_100[1];
        local_f8._M_first._M_storage._M_storage[0x12] = local_100[2];
        local_f8._M_first._M_storage._M_storage[0x13] = local_100[3];
        local_f8._0_8_ = local_110;
        local_f8._M_first._M_storage._M_storage[8] = auStack_108[0];
        local_f8._M_first._M_storage._M_storage[9] = auStack_108[1];
        local_f8._M_first._M_storage._M_storage[10] = auStack_108[2];
        local_f8._M_first._M_storage._M_storage[0xb] = auStack_108[3];
        local_f8._M_first._M_storage._M_storage[0xc] = auStack_108[4];
        local_f8._M_first._M_storage._M_storage[0xd] = auStack_108[5];
        local_f8._M_first._M_storage._M_storage[0xe] = auStack_108[6];
        local_f8._M_first._M_storage._M_storage[0xf] = auStack_108[7];
        local_b0 = 3;
        GetScriptForDestination
                  ((CScript *)&local_80.indirect_contents,(CTxDestination *)&local_f8._M_first);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_f8._M_first);
        iVar3 = (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[3])(this,&local_80);
        if (iVar3 != 0) {
          local_f8._0_8_ = __return_storage_ptr__;
          std::
          _Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<CScript_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<CScript,true>>>>
                    ((_Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)__return_storage_ptr__,&local_80,&local_f8);
        }
        if (0x1c < local_64) {
          free(local_80.indirect_contents.indirect);
        }
      }
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)&local_a8.indirect_contents);
    }
  }
  p_Var5 = (this->setWatchOnly)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->setWatchOnly)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      iVar3 = (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[3])(this,p_Var5 + 1);
      if (iVar3 != 0) {
        local_f8._0_8_ = __return_storage_ptr__;
        std::
        _Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<CScript_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<CScript,true>>>>
                  ((_Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)__return_storage_ptr__,p_Var5 + 1,&local_f8);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_120);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::unordered_set<CScript, SaltedSipHasher> LegacyDataSPKM::GetScriptPubKeys() const
{
    LOCK(cs_KeyStore);
    std::unordered_set<CScript, SaltedSipHasher> spks;

    // All keys have at least P2PK and P2PKH
    for (const auto& key_pair : mapKeys) {
        const CPubKey& pub = key_pair.second.GetPubKey();
        spks.insert(GetScriptForRawPubKey(pub));
        spks.insert(GetScriptForDestination(PKHash(pub)));
    }
    for (const auto& key_pair : mapCryptedKeys) {
        const CPubKey& pub = key_pair.second.first;
        spks.insert(GetScriptForRawPubKey(pub));
        spks.insert(GetScriptForDestination(PKHash(pub)));
    }

    // For every script in mapScript, only the ISMINE_SPENDABLE ones are being tracked.
    // The watchonly ones will be in setWatchOnly which we deal with later
    // For all keys, if they have segwit scripts, those scripts will end up in mapScripts
    for (const auto& script_pair : mapScripts) {
        const CScript& script = script_pair.second;
        if (IsMine(script) == ISMINE_SPENDABLE) {
            // Add ScriptHash for scripts that are not already P2SH
            if (!script.IsPayToScriptHash()) {
                spks.insert(GetScriptForDestination(ScriptHash(script)));
            }
            // For segwit scripts, we only consider them spendable if we have the segwit spk
            int wit_ver = -1;
            std::vector<unsigned char> witprog;
            if (script.IsWitnessProgram(wit_ver, witprog) && wit_ver == 0) {
                spks.insert(script);
            }
        } else {
            // Multisigs are special. They don't show up as ISMINE_SPENDABLE unless they are in a P2SH
            // So check the P2SH of a multisig to see if we should insert it
            std::vector<std::vector<unsigned char>> sols;
            TxoutType type = Solver(script, sols);
            if (type == TxoutType::MULTISIG) {
                CScript ms_spk = GetScriptForDestination(ScriptHash(script));
                if (IsMine(ms_spk) != ISMINE_NO) {
                    spks.insert(ms_spk);
                }
            }
        }
    }

    // All watchonly scripts are raw
    for (const CScript& script : setWatchOnly) {
        // As the legacy wallet allowed to import any script, we need to verify the validity here.
        // LegacyScriptPubKeyMan::IsMine() return 'ISMINE_NO' for invalid or not watched scripts (IsMineResult::INVALID or IsMineResult::NO).
        // e.g. a "sh(sh(pkh()))" which legacy wallets allowed to import!.
        if (IsMine(script) != ISMINE_NO) spks.insert(script);
    }

    return spks;
}